

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

bool google::protobuf::compiler::ruby::GenerateDslDescriptor
               (FileDescriptor *file,Printer *printer,string *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Syntax syntax;
  int i_1;
  long lVar1;
  int i;
  long lVar2;
  string sStack_48;
  
  io::Printer::Print<>(printer,"Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  io::Printer::Indent(printer);
  args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file;
  StringifySyntax_abi_cxx11_(&sStack_48,(ruby *)(ulong)(byte)file[0x3a],syntax);
  io::Printer::Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string>
            (printer,"add_file(\"$filename$\", :syntax => :$syntax$) do\n",(char (*) [9])"filename",
             args_1,(char (*) [7])0x3e0b35,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  io::Printer::Indent(printer);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(file + 0x2c); lVar2 = lVar2 + 1) {
    GenerateMessage((Descriptor *)(*(long *)(file + 0x58) + lVar1),printer,error);
    lVar1 = lVar1 + 0x88;
  }
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(file + 0x30); lVar1 = lVar1 + 1) {
    GenerateEnum((EnumDescriptor *)(*(long *)(file + 0x60) + lVar2),printer);
    lVar2 = lVar2 + 0x48;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"end\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"end\n\n");
  return true;
}

Assistant:

bool GenerateDslDescriptor(const FileDescriptor* file, io::Printer* printer,
                           std::string* error) {
  printer->Print("Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  printer->Indent();
  printer->Print("add_file(\"$filename$\", :syntax => :$syntax$) do\n",
                 "filename", file->name(), "syntax",
                 StringifySyntax(file->syntax()));
  printer->Indent();
  for (int i = 0; i < file->message_type_count(); i++) {
    if (!GenerateMessage(file->message_type(i), printer, error)) {
      return false;
    }
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(file->enum_type(i), printer);
  }
  printer->Outdent();
  printer->Print("end\n");
  printer->Outdent();
  printer->Print(
    "end\n\n");
  return true;
}